

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnnoptimize.cpp
# Opt level: O2

int __thiscall NetOptimize::fwrite_weight_data(NetOptimize *this,Mat *data,FILE *bp)

{
  int iVar1;
  long lVar2;
  long lVar3;
  uchar padding [4];
  Mat data_flattened;
  
  lVar2 = ftell((FILE *)bp);
  ncnn::Mat::reshape(&data_flattened,data,data->h * data->w * data->c,(Allocator *)0x0);
  fwrite(data_flattened.data,data_flattened.elemsize,(long)data_flattened.w,(FILE *)bp);
  lVar3 = ftell((FILE *)bp);
  iVar1 = (int)lVar3 - (int)lVar2;
  padding[0] = '\0';
  padding[1] = '\0';
  padding[2] = '\0';
  padding[3] = '\0';
  fwrite(padding,1,(long)(int)((iVar1 + 3U & 0xfffffffc) - iVar1),(FILE *)bp);
  ncnn::Mat::~Mat(&data_flattened);
  return 0;
}

Assistant:

int NetOptimize::fwrite_weight_data(const ncnn::Mat& data, FILE* bp)
{
    int p0 = ftell(bp);

    ncnn::Mat data_flattened = data.reshape(data.w * data.h * data.c);
    fwrite(data_flattened.data, data_flattened.elemsize, data_flattened.w, bp);

    // padding to 32bit align
    int nwrite = ftell(bp) - p0;
    int nalign = alignSize(nwrite, 4);
    unsigned char padding[4] = {0x00, 0x00, 0x00, 0x00};
    fwrite(padding, sizeof(unsigned char), nalign - nwrite, bp);

    return 0;
}